

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O1

void __thiscall
glcts::anon_unknown_0::UniformLocMixWithImplicitMax::~UniformLocMixWithImplicitMax
          (UniformLocMixWithImplicitMax *this)

{
  deqp::SubcaseBase::~SubcaseBase((SubcaseBase *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

virtual long Run()
	{
		long ret = NO_ERROR;

		GLint max;
		glGetIntegerv(GL_MAX_UNIFORM_LOCATIONS, &max);

		const int implicitCount = 1;

		int tests[3] = { 0, 3, max - implicitCount };

		for (int test = 0; test < 3; test++)
		{
			std::vector<Uniform> uniforms;

			//for performance reasons fill-up all avaliable locations with an unused arrays.
			if (tests[test] > 0)
			{
				//[0..test - 1]
				uniforms.push_back(Uniform(uniformValueGenerator, UniformType(GL_FLOAT, tests[test]), Loc::C(0),
										   DefOccurence::ALL_SH, DefOccurence::NONE_SH));
				assert(uniforms[uniforms.size() - 1].location.val + uniforms[uniforms.size() - 1].type.arraySize ==
					   tests[test]);
			}

			if (tests[test] < max - implicitCount)
			{
				//[test + 1..max]
				uniforms.push_back(
					Uniform(uniformValueGenerator, UniformType(GL_FLOAT, max - implicitCount - tests[test]),
							Loc::C(tests[test] + implicitCount), DefOccurence::ALL_SH, DefOccurence::NONE_SH));
				assert(uniforms[uniforms.size() - 1].location.val + uniforms[uniforms.size() - 1].type.arraySize ==
					   max);
			}

			uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT, Loc::Implicit()));
			ret |= doRun(uniforms);
		}
		return ret;
	}